

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_point.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Point3<double> *this;
  uint uVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing PhyRay Point3f...");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (Point3<double> *)phyr::allocAligned(0x18);
  this->x = 5.0;
  this->y = 6.0;
  this->z = 7.0;
  phyr::Point3<double>::hasNaNs(this);
  std::ostream::_M_insert<bool>(true);
  uVar2 = 1;
  if ((((this->x == 5.0) && (!NAN(this->x))) && (this->y == 6.0)) && (!NAN(this->y))) {
    uVar2 = -(uint)(this->z != 7.0) & 1;
  }
  phyr::freeAligned(this);
  return uVar2;
}

Assistant:

int main(int argc, const char* argv[]) {
    std::cout << "Testing PhyRay Point3f..." << std::endl;

    Point3f* p1 = allocAligned<Point3f>(1);
    Point3f p2(5, 6, 7);
    p1->x = 1; p1->y = 2; p1->z = 3;

    *p1 = p2;

    ASSERT(!p1->hasNaNs());

    bool a = p1->hasNaNs();
    std::cout << a;

    bool valid = *p1 == p2;

    freeAligned(p1);

    return valid ? 0 : 1;
}